

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.hpp
# Opt level: O2

void __thiscall
IfStatementAstNode::IfStatementAstNode
          (IfStatementAstNode *this,shared_ptr<ExpressionAstNode> *expression,
          shared_ptr<StatementAstNode> *ifStatement,shared_ptr<StatementAstNode> *elseStatement)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  (this->super_StatementAstNode).super_AstNode._vptr_AstNode =
       (_func_int **)&PTR__IfStatementAstNode_00138db8;
  (this->expression).super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (expression->super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->expression).super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (expression->super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (expression->super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->expression).super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (expression->super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->ifStatement).super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ifStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->ifStatement).super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (ifStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (ifStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ifStatement).super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (ifStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
  _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (elseStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->elseStatement).
          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2._M_pi = (elseStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  (elseStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this->elseStatement).
          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
          super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       _Var2._M_pi;
  (elseStatement->super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
  _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged = true;
  return;
}

Assistant:

explicit IfStatementAstNode(
    std::shared_ptr<ExpressionAstNode>  expression,
    std::shared_ptr<StatementAstNode>  ifStatement,
    std::shared_ptr<StatementAstNode>  elseStatement
  ) noexcept
  : expression{std::move(expression)},
    ifStatement{std::move(ifStatement)},
    elseStatement{std::move(elseStatement)}
  {}